

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.h
# Opt level: O0

Promise<kj::Maybe<capnproto_test::capnp::test::TestInterface::Server_&>_> __thiscall
capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer
          (CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *this,Client *client)

{
  Promise<void_*> local_28 [2];
  Client *client_local;
  CapabilityServerSet<capnproto_test::capnp::test::TestInterface> *this_local;
  
  client_local = client;
  this_local = this;
  capnp::_::CapabilityServerSetBase::getLocalServerInternal
            ((CapabilityServerSetBase *)local_28,(Client *)client);
  kj::Promise<void*>::
  then<capnp::CapabilityServerSet<capnproto_test::capnp::test::TestInterface>::getLocalServer(capnproto_test::capnp::test::TestInterface::Client&)::_lambda(void*)_1_>
            ((Promise<void*> *)this,(Type *)local_28);
  kj::Promise<void_*>::~Promise(local_28);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<kj::Maybe<typename T::Server&>> CapabilityServerSet<T>::getLocalServer(
    typename T::Client& client) {
  return getLocalServerInternal(client)
      .then([](void* server) -> kj::Maybe<typename T::Server&> {
    if (server == nullptr) {
      return kj::none;
    } else {
      return *reinterpret_cast<typename T::Server*>(server);
    }
  });
}